

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testWav.cpp
# Opt level: O0

void anon_unknown.dwarf_23a84c::test(int nx,int ny)

{
  ostream *poVar1;
  void *this;
  int in_ESI;
  int in_EDI;
  Rand48 rand48;
  Array2D<unsigned_short> b;
  Array2D<unsigned_short> a;
  undefined6 in_stack_ffffffffffffffa8;
  unsigned_short in_stack_ffffffffffffffae;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  Array2D<unsigned_short> *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  Array2D<unsigned_short> *in_stack_ffffffffffffffc8;
  Array2D<unsigned_short> *in_stack_ffffffffffffffd0;
  
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,in_EDI);
  poVar1 = std::operator<<(poVar1," x ");
  this = (void *)std::ostream::operator<<(poVar1,in_ESI);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imf_3_2::Array2D<unsigned_short>::Array2D
            ((Array2D<unsigned_short> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (long)in_stack_ffffffffffffffb8,
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  Imf_3_2::Array2D<unsigned_short>::Array2D
            ((Array2D<unsigned_short> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (long)in_stack_ffffffffffffffb8,
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  Imath_3_2::Rand48::Rand48
            ((Rand48 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             CONCAT26(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8));
  fill1_14bit(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
              in_stack_ffffffffffffffc0,(Rand48 *)in_stack_ffffffffffffffb8);
  wavEncodeDecode((Array2D<unsigned_short> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  fill1_16bit(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
              in_stack_ffffffffffffffc0,(Rand48 *)in_stack_ffffffffffffffb8);
  wavEncodeDecode((Array2D<unsigned_short> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  fill2((Array2D<unsigned_short> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
        in_stack_ffffffffffffffae);
  wavEncodeDecode((Array2D<unsigned_short> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  fill2((Array2D<unsigned_short> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
        in_stack_ffffffffffffffae);
  wavEncodeDecode((Array2D<unsigned_short> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  fill2((Array2D<unsigned_short> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
        in_stack_ffffffffffffffae);
  wavEncodeDecode((Array2D<unsigned_short> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  fill2((Array2D<unsigned_short> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
        in_stack_ffffffffffffffae);
  wavEncodeDecode((Array2D<unsigned_short> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  fill2((Array2D<unsigned_short> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
        in_stack_ffffffffffffffae);
  wavEncodeDecode((Array2D<unsigned_short> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  fill2((Array2D<unsigned_short> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
        in_stack_ffffffffffffffae);
  wavEncodeDecode((Array2D<unsigned_short> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  fill3_14bit((Array2D<unsigned_short> *)
              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  wavEncodeDecode((Array2D<unsigned_short> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  fill3_16bit((Array2D<unsigned_short> *)
              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  wavEncodeDecode((Array2D<unsigned_short> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  fill4_14bit((Array2D<unsigned_short> *)
              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  wavEncodeDecode((Array2D<unsigned_short> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  fill4_16bit((Array2D<unsigned_short> *)
              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  wavEncodeDecode((Array2D<unsigned_short> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  fill5_14bit((Array2D<unsigned_short> *)
              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  wavEncodeDecode((Array2D<unsigned_short> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  fill5_16bit((Array2D<unsigned_short> *)
              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  wavEncodeDecode((Array2D<unsigned_short> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  Imf_3_2::Array2D<unsigned_short>::~Array2D
            ((Array2D<unsigned_short> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  Imf_3_2::Array2D<unsigned_short>::~Array2D
            ((Array2D<unsigned_short> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void
test (int nx, int ny)
{
    cout << nx << " x " << ny << endl;

    Array2D<unsigned short> a (ny, nx);
    Array2D<unsigned short> b (ny, nx);

    IMATH_NAMESPACE::Rand48 rand48 (0);

    fill1_14bit (a, b, nx, ny, rand48);
    wavEncodeDecode (a, b, nx, ny);

    fill1_16bit (a, b, nx, ny, rand48);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 1);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0x3ffe);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0x3fff);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0xfffe);
    wavEncodeDecode (a, b, nx, ny);

    fill2 (a, b, nx, ny, 0xffff);
    wavEncodeDecode (a, b, nx, ny);

    fill3_14bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill3_16bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill4_14bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill4_16bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill5_14bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);

    fill5_16bit (a, b, nx, ny);
    wavEncodeDecode (a, b, nx, ny);
}